

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O1

S2Cap * __thiscall
S2MaxDistanceShapeIndexTarget::GetCapBound
          (S2Cap *__return_storage_ptr__,S2MaxDistanceShapeIndexTarget *this)

{
  Iterator *pIVar1;
  bool bVar2;
  S2Cap cap;
  S2ShapeIndexRegion<S2ShapeIndex> local_60;
  S2Cap local_38;
  
  local_60.contains_query_.index_ = this->index_;
  pIVar1 = &local_60.contains_query_.it_;
  local_60.super_S2Region._vptr_S2Region = (_func_int **)&PTR__S2ShapeIndexRegion_002c2828;
  local_60.contains_query_.options_.vertex_model_ = SEMI_OPEN;
  (*((ostream *)local_60.contains_query_.index_)->_vptr_basic_ostream[6])
            (pIVar1,local_60.contains_query_.index_,2);
  local_60.iter_ = pIVar1;
  S2ShapeIndexRegion<S2ShapeIndex>::GetCapBound(&local_38,&local_60);
  if (local_60.contains_query_.it_.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_60.contains_query_.it_.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c1748;
  (__return_storage_ptr__->center_).c_[0] = -local_38.center_.c_[0];
  (__return_storage_ptr__->center_).c_[1] = -local_38.center_.c_[1];
  (__return_storage_ptr__->center_).c_[2] = -local_38.center_.c_[2];
  (__return_storage_ptr__->radius_).length2_ = local_38.radius_.length2_;
  bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
  if ((bVar2) && ((__return_storage_ptr__->radius_).length2_ <= 4.0)) {
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_60,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
             ,0xf5,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_60.contains_query_.index_,"Check failed: is_valid() ",0x19);
  abort();
}

Assistant:

S2Cap S2MaxDistanceShapeIndexTarget::GetCapBound() {
  S2Cap cap = MakeS2ShapeIndexRegion(index_).GetCapBound();
  return S2Cap(-cap.center(), cap.radius());
}